

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# select_iterrupter.cpp
# Opt level: O3

void __thiscall booster::aio::impl::select_interrupter::notify(select_interrupter *this)

{
  ssize_t sVar1;
  int *piVar2;
  undefined1 local_19;
  
  local_19 = 0x41;
  sVar1 = write(this->write_,&local_19,1);
  if (sVar1 < 0) {
    piVar2 = __errno_location();
    do {
      if (*piVar2 != 4) {
        return;
      }
      local_19 = 0x41;
      sVar1 = write(this->write_,&local_19,1);
    } while (sVar1 < 0);
  }
  return;
}

Assistant:

void select_interrupter::notify()
	{
		#ifdef BOOSTER_WIN32
		char c='A';
		::send(write_,&c,1,0);
		#else
		for(;;) {
			char c='A';
			if(::write(write_,&c,1) < 0 && errno==EINTR)
				continue;
			break;
		}
		#endif
	}